

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

tlc_linecount_t
TURBOLINECOUNT::CLineCount::LineCount(TCHAR *filename,tlc_error_t *error,tlc_string_t *errorstring)

{
  bool bVar1;
  int iVar2;
  int __oflag;
  tlc_linecount_t tVar3;
  tlc_linecount_t count;
  CLineCount lc;
  tlc_linecount_t local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  CLineCount local_a8;
  
  CLineCount(&local_a8,(PARAMETERS *)0x0);
  iVar2 = open(&local_a8,filename,__oflag);
  if ((char)iVar2 == '\0') {
    if (error != (tlc_error_t *)0x0) {
      *error = local_a8.m_lasterror;
    }
    tVar3 = -1;
    if (errorstring == (tlc_string_t *)0x0) goto LAB_001035a6;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_a8.m_lasterrorstring._M_dataplus._M_p,
               local_a8.m_lasterrorstring._M_dataplus._M_p +
               local_a8.m_lasterrorstring._M_string_length);
  }
  else {
    bVar1 = countLines(&local_a8,&local_d0);
    if (bVar1) {
      *error = 0;
      std::__cxx11::string::_M_replace
                ((ulong)errorstring,0,(char *)errorstring->_M_string_length,0x1040c8);
      tVar3 = local_d0;
      goto LAB_001035a6;
    }
    if (error != (tlc_error_t *)0x0) {
      *error = local_a8.m_lasterror;
    }
    tVar3 = -1;
    if (errorstring == (tlc_string_t *)0x0) goto LAB_001035a6;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_a8.m_lasterrorstring._M_dataplus._M_p,
               local_a8.m_lasterrorstring._M_dataplus._M_p +
               local_a8.m_lasterrorstring._M_string_length);
  }
  tVar3 = -1;
  std::__cxx11::string::operator=((string *)errorstring,(string *)local_c8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
LAB_001035a6:
  ~CLineCount(&local_a8);
  return tVar3;
}

Assistant:

tlc_linecount_t CLineCount::LineCount(const TCHAR *filename, tlc_error_t * error, tlc_string_t *errorstring)
{
	CLineCount lc;
	if (!lc.open(filename))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}

		return -1;
	}

	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}
		return -1;
	}

	*error = 0;
	*errorstring = _T("");

	return count;
}